

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offsets.cpp
# Opt level: O0

bool __thiscall loader::offsets::load_offsets_at(offsets *this,istream *is,uint32_t pos)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  char *pcVar5;
  long *in_RSI;
  EVP_PKEY_CTX *ctx;
  crc32 *in_RDI;
  uint32_t expected;
  uint32_t revision;
  crc32 checksum;
  size_t i;
  version_constant version;
  char magic [12];
  istream *in_stack_fffffffffffffac8;
  char (*i_00) [10];
  logger *in_stack_fffffffffffffad0;
  logger *in_stack_fffffffffffffaf0;
  char *data;
  char local_4f0 [240];
  logger *in_stack_fffffffffffffc00;
  logger local_368;
  uint local_1e8;
  crc32 local_1e4;
  unsigned_long local_1e0 [51];
  char *local_48;
  uint local_40;
  EVP_PKEY_CTX local_3c [12];
  undefined8 local_30;
  undefined8 local_28;
  long *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  std::fpos<__mbstate_t>::fpos
            ((fpos<__mbstate_t> *)in_stack_fffffffffffffad0,(streamoff)in_stack_fffffffffffffac8);
  std::istream::seekg(in_RSI,local_30,local_28);
  uVar4 = std::ios::fail();
  if ((uVar4 & 1) == 0) {
    ctx = local_3c;
    std::istream::read((char *)local_18,(long)ctx);
    uVar4 = std::ios::fail();
    if ((uVar4 & 1) == 0) {
      local_40 = 0;
      local_48 = (char *)0x0;
      while (data = local_48,
            pcVar5 = (char *)boost::size<loader::(anonymous_namespace)::setup_loader_version[7]>
                                       ((setup_loader_version (*) [7])0x16b1b2), data < pcVar5) {
        ctx = (EVP_PKEY_CTX *)
              ((anonymous_namespace)::known_setup_loader_versions + (long)local_48 * 0x10);
        iVar1 = memcmp(local_3c,ctx,0xc);
        if (iVar1 == 0) {
          local_40 = *(uint *)((anonymous_namespace)::known_setup_loader_versions +
                              (long)local_48 * 0x10 + 0xc);
          break;
        }
        local_48 = local_48 + 1;
      }
      if (local_40 == 0) {
        logger::logger(in_stack_fffffffffffffad0,
                       (log_level)((ulong)in_stack_fffffffffffffac8 >> 0x20));
        in_stack_fffffffffffffaf0 =
             logger::operator<<(in_stack_fffffffffffffad0,(char (*) [10])in_stack_fffffffffffffac8);
        local_1e0[0] = (unsigned_long)
                       boost::iostreams::detail::
                       call_reset<boost::iostreams::detail::optional<boost::iostreams::detail::concept_adapter<stream::restricted_source<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>>>>>
                                 ((unsigned_long)in_stack_fffffffffffffac8);
        ctx = (EVP_PKEY_CTX *)local_1e0;
        logger::operator<<(in_stack_fffffffffffffad0,(print_hex<char_*> *)in_stack_fffffffffffffac8)
        ;
        logger::~logger(in_stack_fffffffffffffc00);
        local_40 = std::numeric_limits<unsigned_int>::max();
      }
      crypto::crc32::init(&local_1e4,ctx);
      crypto::crc32::update(in_RDI,data,(size_t)in_stack_fffffffffffffaf0);
      if (0x50104ff < local_40) {
        local_1e8 = crypto::checksum_base<crypto::crc32>::load<unsigned_int>
                              ((checksum_base<crypto::crc32> *)in_stack_fffffffffffffad0,
                               in_stack_fffffffffffffac8);
        uVar4 = std::ios::fail();
        if ((uVar4 & 1) != 0) {
          std::ios::clear((int)local_18 + (int)*(undefined8 *)(*local_18 + -0x18));
          return false;
        }
        if (local_1e8 != 1) {
          in_stack_fffffffffffffad0 = &local_368;
          logger::logger(in_stack_fffffffffffffad0,
                         (log_level)((ulong)in_stack_fffffffffffffac8 >> 0x20));
          logger::operator<<(in_stack_fffffffffffffad0,(char (*) [10])in_stack_fffffffffffffac8);
          logger::operator<<(in_stack_fffffffffffffad0,(uint *)in_stack_fffffffffffffac8);
          logger::~logger(in_stack_fffffffffffffc00);
        }
      }
      crypto::checksum_base<crypto::crc32>::load<unsigned_int>
                ((checksum_base<crypto::crc32> *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8
                );
      uVar2 = crypto::checksum_base<crypto::crc32>::load<unsigned_int>
                        ((checksum_base<crypto::crc32> *)in_stack_fffffffffffffad0,
                         in_stack_fffffffffffffac8);
      in_RDI[1].crc = uVar2;
      if (local_40 < 0x4010600) {
        uVar2 = crypto::checksum_base<crypto::crc32>::load<unsigned_int>
                          ((checksum_base<crypto::crc32> *)in_stack_fffffffffffffad0,
                           in_stack_fffffffffffffac8);
        in_RDI[2].crc = uVar2;
      }
      else {
        in_RDI[2].crc = 0;
      }
      uVar2 = crypto::checksum_base<crypto::crc32>::load<unsigned_int>
                        ((checksum_base<crypto::crc32> *)in_stack_fffffffffffffad0,
                         in_stack_fffffffffffffac8);
      in_RDI[3].crc = uVar2;
      if (local_40 < 0x4000300) {
        in_RDI[0xc].crc = 1;
        uVar2 = crypto::checksum_base<crypto::crc32>::load<unsigned_int>
                          ((checksum_base<crypto::crc32> *)in_stack_fffffffffffffad0,
                           in_stack_fffffffffffffac8);
        in_RDI[4].crc = uVar2;
      }
      else {
        in_RDI[0xc].crc = 2;
        uVar2 = crypto::checksum_base<crypto::crc32>::load<unsigned_int>
                          ((checksum_base<crypto::crc32> *)in_stack_fffffffffffffad0,
                           in_stack_fffffffffffffac8);
        in_RDI[4].crc = uVar2;
      }
      if (local_40 < 0x4000000) {
        uVar2 = util::load<unsigned_int>((istream *)0x16b50d);
        in_RDI[0xd].crc = uVar2;
      }
      else {
        in_RDI[0xd].crc = 0;
      }
      uVar2 = crypto::checksum_base<crypto::crc32>::load<unsigned_int>
                        ((checksum_base<crypto::crc32> *)in_stack_fffffffffffffad0,
                         in_stack_fffffffffffffac8);
      in_RDI[0xe].crc = uVar2;
      uVar2 = crypto::checksum_base<crypto::crc32>::load<unsigned_int>
                        ((checksum_base<crypto::crc32> *)in_stack_fffffffffffffad0,
                         in_stack_fffffffffffffac8);
      in_RDI[0xf].crc = uVar2;
      uVar4 = std::ios::fail();
      if ((uVar4 & 1) == 0) {
        if (0x40009ff < local_40) {
          uVar2 = util::load<unsigned_int>((istream *)0x16b5b0);
          uVar4 = std::ios::fail();
          if ((uVar4 & 1) != 0) {
            std::ios::clear((int)local_18 + (int)*(undefined8 *)(*local_18 + -0x18));
            return false;
          }
          uVar3 = crypto::crc32::finalize(&local_1e4);
          if (uVar3 != uVar2) {
            i_00 = (char (*) [10])local_4f0;
            logger::logger(in_stack_fffffffffffffad0,(log_level)((ulong)i_00 >> 0x20));
            logger::operator<<(in_stack_fffffffffffffad0,i_00);
            logger::~logger(in_stack_fffffffffffffc00);
          }
        }
        local_1 = true;
      }
      else {
        std::ios::clear((int)local_18 + (int)*(undefined8 *)(*local_18 + -0x18));
        local_1 = false;
      }
    }
    else {
      std::ios::clear((int)local_18 + (int)*(undefined8 *)(*local_18 + -0x18));
      local_1 = false;
    }
  }
  else {
    std::ios::clear((int)local_18 + (int)*(undefined8 *)(*local_18 + -0x18));
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool offsets::load_offsets_at(std::istream & is, boost::uint32_t pos) {
	
	if(is.seekg(pos).fail()) {
		is.clear();
		debug("could not seek to loader header");
		return false;
	}
	
	char magic[12];
	if(is.read(magic, std::streamsize(sizeof(magic))).fail()) {
		is.clear();
		debug("could not read loader header magic");
		return false;
	}
	
	setup::version_constant version = 0;
	for(size_t i = 0; i < size_t(boost::size(known_setup_loader_versions)); i++) {
		BOOST_STATIC_ASSERT(sizeof(known_setup_loader_versions[i].magic) == sizeof(magic));
		if(!memcmp(magic, known_setup_loader_versions[i].magic, sizeof(magic))) {
			version = known_setup_loader_versions[i].version;
			debug("found loader header magic version " << setup::version(version));
			break;
		}
	}
	if(!version) {
		log_warning << "Unexpected setup loader magic: " << print_hex(magic);
		version = std::numeric_limits<setup::version_constant>::max();
	}
	
	crypto::crc32 checksum;
	checksum.init();
	checksum.update(magic, sizeof(magic));
	
	if(version >= INNO_VERSION(5, 1,  5)) {
		boost::uint32_t revision = checksum.load<boost::uint32_t>(is);
		if(is.fail()) {
			is.clear();
			debug("could not read loader header revision");
			return false;
		} else if(revision != 1) {
			log_warning << "Unexpected setup loader revision: " << revision;
		}
	}
	
	(void)checksum.load<boost::uint32_t>(is);
	exe_offset = checksum.load<boost::uint32_t>(is);
	
	if(version >= INNO_VERSION(4, 1, 6)) {
		exe_compressed_size = 0;
	} else {
		exe_compressed_size = checksum.load<boost::uint32_t>(is);
	}
	
	exe_uncompressed_size = checksum.load<boost::uint32_t>(is);
	
	if(version >= INNO_VERSION(4, 0, 3)) {
		exe_checksum.type = crypto::CRC32;
		exe_checksum.crc32 = checksum.load<boost::uint32_t>(is);
	} else {
		exe_checksum.type = crypto::Adler32;
		exe_checksum.adler32 = checksum.load<boost::uint32_t>(is);
	}
	
	if(version >= INNO_VERSION(4, 0, 0)) {
		message_offset = 0;
	} else {
		message_offset = util::load<boost::uint32_t>(is);
	}
	
	header_offset = checksum.load<boost::uint32_t>(is);
	data_offset = checksum.load<boost::uint32_t>(is);
	
	if(is.fail()) {
		is.clear();
		debug("could not read loader header");
		return false;
	}
	
	if(version >= INNO_VERSION(4, 0, 10)) {
		boost::uint32_t expected = util::load<boost::uint32_t>(is);
		if(is.fail()) {
			is.clear();
			debug("could not read loader header checksum");
			return false;
		}
		if(checksum.finalize() != expected) {
			log_warning << "Setup loader checksum mismatch!";
		}
	}
	
	return true;
}